

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

bool __thiscall glslang::TType::sameCoopVecBaseType(TType *this,TType *right)

{
  int iVar1;
  bool bVar2;
  
  if (((this->field_0xb & 8) == 0) || ((right->field_0xb & 8) == 0)) {
LAB_003b5457:
    bVar2 = false;
  }
  else {
    iVar1 = (*this->_vptr_TType[7])();
    if ((iVar1 == 1) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 3)) {
      iVar1 = (*right->_vptr_TType[7])(right);
      if (iVar1 == 1) {
        return true;
      }
      iVar1 = (*right->_vptr_TType[7])(right);
      if (iVar1 == 3) {
        return true;
      }
    }
    else {
      iVar1 = (*this->_vptr_TType[7])(this);
      if (((iVar1 == 9) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 5)) ||
         (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 7)) {
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 9) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 5) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 7) {
          return true;
        }
      }
      else {
        iVar1 = (*this->_vptr_TType[7])(this);
        if (((iVar1 != 8) && (iVar1 = (*this->_vptr_TType[7])(this), iVar1 != 4)) &&
           (iVar1 = (*this->_vptr_TType[7])(this), iVar1 != 6)) goto LAB_003b5457;
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 8) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 4) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 6) {
          return true;
        }
      }
    }
    iVar1 = (*right->_vptr_TType[7])(right);
    bVar2 = iVar1 == 0x19;
  }
  return bVar2;
}

Assistant:

bool isCoopVecNV() const { return coopvecNV; }